

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O0

ElemBase *
Assimp::Blender::getCustomDataLayerData(CustomData *customdata,CustomDataType cdtype,string *name)

{
  bool bVar1;
  element_type *peVar2;
  undefined1 local_38 [8];
  shared_ptr<Assimp::Blender::CustomDataLayer> pLayer;
  string *name_local;
  CustomDataType cdtype_local;
  CustomData *customdata_local;
  
  pLayer.super___shared_ptr<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  getCustomDataLayer((Blender *)local_38,customdata,cdtype,name);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (bVar1) {
    peVar2 = ::std::
             __shared_ptr_access<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->data);
    if (bVar1) {
      peVar2 = ::std::
               __shared_ptr_access<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::Blender::CustomDataLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      customdata_local =
           (CustomData *)
           ::std::__shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(peVar2->data).
                       super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>);
      goto LAB_0066d202;
    }
  }
  customdata_local = (CustomData *)0x0;
LAB_0066d202:
  ::std::shared_ptr<Assimp::Blender::CustomDataLayer>::~shared_ptr
            ((shared_ptr<Assimp::Blender::CustomDataLayer> *)local_38);
  return &customdata_local->super_ElemBase;
}

Assistant:

const ElemBase * getCustomDataLayerData(const CustomData &customdata, const CustomDataType cdtype, const std::string &name)
        {
            const std::shared_ptr<CustomDataLayer> pLayer = getCustomDataLayer(customdata, cdtype, name);
            if (pLayer && pLayer->data) {
                return pLayer->data.get();
            }
            return nullptr;
        }